

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void google::protobuf::DescriptorPool::InternalAddGeneratedFile
               (void *encoded_file_descriptor,int size)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_49;
  undefined1 local_48 [56];
  
  if ((anonymous_namespace)::generated_pool_init_ != 2) {
    local_48._0_8_ = &PTR__FunctionClosure0_002947d8;
    local_48._8_8_ = anon_unknown_1::InitGeneratedPool;
    local_48[0x10] = false;
    GoogleOnceInitImpl(&(anonymous_namespace)::generated_pool_init_,(Closure *)local_48);
    internal::FunctionClosure0::~FunctionClosure0((FunctionClosure0 *)local_48);
  }
  bVar1 = EncodedDescriptorDatabase::Add
                    ((anonymous_namespace)::generated_database_,encoded_file_descriptor,size);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x3ba);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_48,
                       "CHECK failed: generated_database_->Add(encoded_file_descriptor, size): ");
    internal::LogFinisher::operator=(&local_49,other);
    if (!bVar1) {
      internal::LogMessage::~LogMessage((LogMessage *)local_48);
    }
  }
  return;
}

Assistant:

void DescriptorPool::InternalAddGeneratedFile(
    const void* encoded_file_descriptor, int size) {
  // So, this function is called in the process of initializing the
  // descriptors for generated proto classes.  Each generated .pb.cc file
  // has an internal procedure called AddDescriptors() which is called at
  // process startup, and that function calls this one in order to register
  // the raw bytes of the FileDescriptorProto representing the file.
  //
  // We do not actually construct the descriptor objects right away.  We just
  // hang on to the bytes until they are actually needed.  We actually construct
  // the descriptor the first time one of the following things happens:
  // * Someone calls a method like descriptor(), GetDescriptor(), or
  //   GetReflection() on the generated types, which requires returning the
  //   descriptor or an object based on it.
  // * Someone looks up the descriptor in DescriptorPool::generated_pool().
  //
  // Once one of these happens, the DescriptorPool actually parses the
  // FileDescriptorProto and generates a FileDescriptor (and all its children)
  // based on it.
  //
  // Note that FileDescriptorProto is itself a generated protocol message.
  // Therefore, when we parse one, we have to be very careful to avoid using
  // any descriptor-based operations, since this might cause infinite recursion
  // or deadlock.
  InitGeneratedPoolOnce();
  GOOGLE_CHECK(generated_database_->Add(encoded_file_descriptor, size));
}